

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpconv.c
# Opt level: O3

int idyntree_private_fpconv_dtoa(double d,char *dest)

{
  int iVar1;
  uint64_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char *pcVar5;
  ulong uVar6;
  uint uVar7;
  uint64_t *puVar8;
  long lVar9;
  char cVar10;
  byte bVar11;
  uint uVar12;
  long lVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  uint uVar27;
  ulong *puVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  char digits [18];
  undefined8 local_100;
  char local_f8 [24];
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  char *local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  double local_40;
  ulong local_38;
  
  bVar31 = (long)d < 0;
  if (bVar31) {
    *dest = '-';
  }
  local_98 = dest + bVar31;
  if ((d == 0.0) && (!NAN(d))) {
    *local_98 = '0';
    uVar14 = 1;
    goto LAB_001365df;
  }
  uVar20 = (ulong)d & 0xfffffffffffff;
  if ((~(ulong)d & 0x7ff0000000000000) == 0) {
    if (uVar20 == 0) {
      local_98[0] = 'i';
      local_98[1] = 'n';
      local_98[2] = 'f';
    }
    else {
      local_98[0] = 'n';
      local_98[1] = 'a';
      local_98[2] = 'n';
    }
    uVar14 = 3;
    goto LAB_001365df;
  }
  local_40 = d;
  uVar14 = (uint)((ulong)d >> 0x34) & 0x7ff;
  uVar15 = uVar20 | 0x10000000000000;
  if (uVar14 == 0) {
    uVar15 = uVar20;
  }
  uVar22 = uVar15 * 2 + 1;
  if (uVar14 == 0) {
    lVar21 = 0x3f;
    if ((uVar22 & 0x1fffffffffffff) != 0) {
      for (; (uVar22 & 0x1fffffffffffff) >> lVar21 == 0; lVar21 = lVar21 + -1) {
      }
    }
    uVar22 = uVar22 << (~(byte)lVar21 + 0x36 & 0x3f);
    iVar18 = ((uint)lVar21 ^ 0xffffffc0) - 0x427;
    cVar10 = -0x27;
  }
  else {
    iVar18 = uVar14 - 0x433;
    cVar10 = (char)uVar14 + -0x28;
  }
  lVar21 = 0x3f;
  if (uVar20 != 0) {
    for (; uVar20 >> lVar21 == 0; lVar21 = lVar21 + -1) {
    }
  }
  iVar19 = (int)((double)(-0x4c - iVar18) * 0.30102999566398114);
  iVar1 = iVar19 + 0x15c;
  iVar19 = iVar19 + 0x163;
  if (-1 < iVar1) {
    iVar19 = iVar1;
  }
  iVar19 = iVar19 >> 3;
  while( true ) {
    iVar1 = iVar18 + -0xb + powers_ten[iVar19].exp;
    iVar16 = 1;
    if ((-0x7d < iVar1) && (iVar16 = -1, iVar1 < -0x5f)) break;
    iVar19 = iVar19 + iVar16;
  }
  uVar25 = uVar20 | 0x10000000000000;
  if (uVar14 == 0) {
    uVar25 = uVar20 << (~(byte)lVar21 + 0x35 & 0x3f);
  }
  uVar24 = (uVar15 << (uVar15 == 0x10000000000000) + 1) + -1 <<
           ((~(uVar15 == 0x10000000000000) + cVar10) - (char)iVar18 & 0x3fU);
  uVar15 = powers_ten[iVar19].frac & 0xffffffff;
  uVar29 = uVar25 << 0xb & 0xffffffff;
  local_48 = powers_ten[iVar19].frac >> 0x20;
  local_a8 = local_48 * uVar29;
  uVar23 = uVar22 << 10 & 0xffffffff;
  local_b0 = local_48 * uVar23;
  bVar11 = -((char)iVar18 + (char)powers_ten[iVar19].exp) - 0x35;
  uVar20 = uVar24 & 0xffffffff;
  local_68 = local_48 * uVar20;
  uVar24 = uVar24 >> 0x20;
  local_58 = uVar15 * uVar24;
  local_60 = uVar24 * local_48;
  local_50 = uVar15 * uVar20 >> 0x20;
  local_78 = local_58 & 0xffffffff;
  local_80 = local_68 & 0xffffffff;
  local_58 = local_58 >> 0x20;
  local_68 = local_68 >> 0x20;
  local_70 = (uVar22 << 10) >> 0x20;
  local_a0 = uVar23 * uVar15 >> 0x20;
  local_d8 = uVar15 * local_70 & 0xffffffff;
  local_e0 = local_b0 & 0xffffffff;
  local_b8 = uVar15 * local_70 >> 0x20;
  local_b0 = local_b0 >> 0x20;
  uVar20 = local_d8 + local_e0 + local_a0 + 0x80000000 >> 0x20;
  local_c0 = local_48 * local_70;
  lVar21 = local_48 * local_70 + local_b8 + local_b0;
  uVar23 = (uVar20 + lVar21) - 1;
  local_88 = (uVar25 << 0xb) >> 0x20;
  lVar26 = local_48 * local_88;
  local_100 = uVar29 * uVar15 >> 0x20;
  local_c8 = uVar15 * local_88 & 0xffffffff;
  local_d0 = local_a8 & 0xffffffff;
  uVar22 = uVar15 * local_88 >> 0x20;
  local_a8 = local_a8 >> 0x20;
  local_90 = uVar23 - (uVar22 + lVar26 + local_a8 +
                      (local_c8 + local_d0 + local_100 + 0x80000000 >> 0x20));
  uVar20 = (~((local_78 + local_80 + local_50 + 0x80000000 >> 0x20) + local_58 + local_60 + local_68
             ) + lVar21 + uVar20) - 1;
  uVar7 = iVar19 * -8 + 0x15c;
  uVar15 = 1L << (bVar11 & 0x3f);
  uVar25 = uVar23 >> (bVar11 & 0x3f);
  uVar27 = iVar19 * -8 + 0x165;
  local_38 = uVar15 - 1;
  uVar23 = uVar23 & uVar15 - 1;
  uVar17 = 0;
  puVar28 = tens + 10;
  uVar14 = 0xb;
  do {
    uVar29 = *puVar28;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar29;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar25;
    auVar4 = auVar4 / auVar3;
    uVar12 = 0;
    if (uVar17 != 0 || (auVar4 & (undefined1  [16])0xffffffff) != (undefined1  [16])0x0) {
      local_f8[(int)uVar17] = auVar4[0] + '0';
      uVar12 = uVar17 + 1;
    }
    uVar17 = uVar12;
    uVar6 = local_90;
    uVar25 = uVar25 - (auVar4._0_8_ & 0xffffffff) * uVar29;
    lVar21 = uVar25 << (bVar11 & 0x3f);
    uVar24 = lVar21 + uVar23;
    if (uVar24 <= uVar20) {
      uVar29 = uVar29 << (bVar11 & 0x3f);
      uVar7 = uVar27;
      if ((local_90 <= uVar24) || (uVar20 - uVar24 < uVar29)) goto LAB_00136465;
      uVar15 = local_a0 + local_e0 + local_d8 + 0x80000000 >> 0x20;
      lVar9 = local_b0 + local_b8 + uVar15 + local_c0;
      lVar13 = (local_100 + local_d0 + local_c8 + 0x80000000 >> 0x20) + local_a8 + uVar22;
      uVar24 = (~(lVar26 + lVar13) + lVar9) - uVar24;
      uVar20 = uVar23 + uVar29 + lVar21;
      uVar22 = lVar21 + ((((local_48 * (local_88 - local_70) + lVar13 + uVar23 + uVar29) - local_b0)
                         - local_b8) - uVar15) + 1;
      uVar15 = ((lVar9 - ((local_50 + local_80 + local_78 + 0x80000000 >> 0x20) +
                          local_58 + local_68 + local_60)) - uVar20) - 2;
      goto LAB_00136433;
    }
    puVar28 = puVar28 + 1;
    uVar14 = uVar14 - 1;
    uVar27 = uVar27 - 1;
  } while (1 < uVar14);
  local_100 = (((local_100 + local_d0 + local_c8 + 0x80000000 >> 0x20) + local_a8 + uVar22 + lVar26)
              - ((local_a0 + local_e0 + local_d8 + 0x80000000 >> 0x20) + local_b0 + local_b8 +
                local_c0)) + 1;
  puVar8 = tens + 0x12;
  iVar18 = 0;
  uVar14 = uVar17;
  do {
    uVar22 = uVar23 * 10 >> (bVar11 & 0x3f);
    uVar27 = 0;
    if ((int)uVar22 != 0 || uVar14 != 0) {
      uVar27 = uVar14 + 1;
      local_f8[(int)uVar14] = (char)uVar22 + '0';
    }
    uVar20 = uVar20 * 10;
    iVar18 = iVar18 + -1;
    uVar23 = uVar23 * 10 & local_38;
    if (uVar20 < uVar23 || uVar20 - uVar23 == 0) {
      puVar8 = puVar8 + -1;
    }
    else {
      uVar7 = uVar7 + iVar18;
      uVar17 = uVar27;
      if (uVar20 - uVar23 < uVar15) break;
      uVar2 = *puVar8;
      uVar22 = uVar2 * local_90;
      uVar25 = uVar22 - uVar23;
      if (uVar22 < uVar23 || uVar25 == 0) break;
      uVar29 = uVar15 + uVar23;
      uVar24 = uVar20 - uVar29;
      do {
        if ((uVar22 <= uVar29) && (uVar25 <= uVar2 * local_100 + uVar29)) break;
        local_f8[(long)(int)uVar27 + -1] = local_f8[(long)(int)uVar27 + -1] + -1;
        bVar30 = uVar15 <= uVar24;
        uVar24 = uVar24 - uVar15;
        if (uVar22 <= uVar29) break;
        uVar25 = uVar25 - uVar15;
        uVar29 = uVar29 + uVar15;
      } while (bVar30);
      uVar29 = (ulong)uVar27;
    }
    uVar17 = (uint)uVar29;
    uVar14 = uVar27;
  } while (uVar20 <= uVar23);
  goto LAB_00136465;
  while( true ) {
    local_f8[(long)(int)uVar17 + -1] = local_f8[(long)(int)uVar17 + -1] + -1;
    bVar30 = uVar15 < uVar29;
    uVar15 = uVar15 - uVar29;
    if (uVar6 <= uVar20) break;
    uVar24 = uVar24 - uVar29;
    uVar20 = uVar20 + uVar29;
    uVar22 = uVar22 + uVar29;
    if (bVar30) break;
LAB_00136433:
    if ((uVar6 <= uVar20) && (uVar24 <= uVar22)) break;
  }
LAB_00136465:
  pcVar5 = local_98;
  uVar14 = uVar17 + uVar7;
  uVar27 = (uVar17 - 1) + uVar7;
  if ((int)uVar14 < 1) {
    uVar27 = 1 - uVar14;
  }
  uVar20 = (ulong)uVar27;
  if ((-1 < (int)uVar7) && ((int)uVar27 < (int)(uVar17 + 7))) {
    memcpy(local_98,local_f8,(long)(int)uVar17);
    memset(pcVar5 + (int)uVar17,0x30,(ulong)uVar7);
    goto LAB_001365df;
  }
  if (((int)uVar7 < 0) && ((0xfffffff9 < uVar7 || ((int)uVar27 < 4)))) {
    if ((int)uVar14 < 1) {
      local_98[0] = '0';
      local_98[1] = '.';
      memset(local_98 + 2,0x30,(ulong)-uVar14);
      memcpy(pcVar5 + (ulong)-uVar14 + 2,local_f8,(long)(int)uVar17);
      uVar14 = (uVar17 - uVar14) + 2;
    }
    else {
      uVar20 = (ulong)uVar14;
      memcpy(local_98,local_f8,uVar20);
      pcVar5[uVar20] = '.';
      memcpy(pcVar5 + uVar20 + 1,local_f8 + uVar20,(ulong)-uVar7);
      uVar14 = uVar17 + 1;
    }
    goto LAB_001365df;
  }
  uVar14 = (int)((long)local_40 >> 0x3f) + 0x12;
  if ((int)uVar17 <= (int)uVar14) {
    uVar14 = uVar17;
  }
  *local_98 = local_f8[0];
  uVar12 = 1;
  if (1 < (int)uVar17) {
    local_98[1] = '.';
    memcpy(local_98 + 2,local_f8 + 1,(ulong)(uVar14 - 1));
    uVar12 = uVar14 + 1;
  }
  uVar22 = (ulong)uVar12;
  pcVar5[uVar22] = 'e';
  uVar15 = uVar22 + 2;
  pcVar5[(long)(int)uVar12 + 1] =
       (uVar14 + uVar7 == 0 || SCARRY4(uVar14,uVar7) != (int)(uVar14 + uVar7) < 0) * '\x02' + '+';
  if ((int)uVar27 < 100) {
    uVar22 = uVar15 & 0xffffffff;
    if (9 < (int)uVar27) {
LAB_0013657c:
      pcVar5[uVar22 & 0xffffffff] = (char)(uVar20 / 10) + '0';
      uVar27 = (int)uVar20 + (int)(uVar20 / 10) * -10;
      uVar15 = (ulong)((int)uVar22 + 1);
    }
  }
  else {
    uVar22 = uVar22 + 3;
    pcVar5[uVar15] = (char)(uVar20 / 100) + '0';
    uVar27 = uVar27 % 100;
    uVar20 = (ulong)uVar27;
    if (9 < uVar27) goto LAB_0013657c;
    pcVar5[uVar22] = '0';
    uVar15 = (ulong)(uVar12 + 4);
  }
  uVar14 = (int)uVar15 + 1;
  pcVar5[uVar15 & 0xffffffff] =
       (char)uVar27 +
       ((char)(uint)((ulong)((long)(int)uVar27 * 0x66666667) >> 0x22) - (char)((int)uVar27 >> 0x1f))
       * -10 + '0';
LAB_001365df:
  return uVar14 + bVar31;
}

Assistant:

int idyntree_private_fpconv_dtoa(double d, char dest[24])
{
    char digits[18];

    int str_len = 0;
    bool neg = false;

    if(get_dbits(d) & signmask) {
        dest[0] = '-';
        str_len++;
        neg = true;
    }

    int spec = filter_special(d, dest + str_len);

    if(spec) {
        return str_len + spec;
    }

    int K = 0;
    int ndigits = grisu2(d, digits, &K);

    str_len += emit_digits(digits, ndigits, dest + str_len, K, neg);

    return str_len;
}